

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawgeti(lua_State *L,int idx,lua_Integer n)

{
  int iVar1;
  Table *t_00;
  TValue *val;
  Table *t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_00 = gettable(L,idx);
  val = luaH_getint(t_00,n);
  iVar1 = finishrawget(L,val);
  return iVar1;
}

Assistant:

LUA_API int lua_rawgeti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lua_lock(L);
  t = gettable(L, idx);
  return finishrawget(L, luaH_getint(t, n));
}